

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2018.h
# Opt level: O3

void __thiscall DRAG<RemSP>::SecondScan(DRAG<RemSP> *this)

{
  long lVar1;
  Mat1i *pMVar2;
  Mat1b *pMVar3;
  long lVar4;
  long lVar5;
  uint *puVar6;
  uint *puVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  long lVar19;
  uint uVar20;
  long lVar21;
  uint uVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  
  puVar6 = RemSP::P_;
  uVar9 = 1;
  if (1 < RemSP::length_) {
    uVar9 = 1;
    uVar15 = 1;
    do {
      if (puVar6[uVar15] < uVar15) {
        uVar20 = puVar6[puVar6[uVar15]];
      }
      else {
        uVar20 = uVar9;
        uVar9 = uVar9 + 1;
      }
      puVar6[uVar15] = uVar20;
      uVar15 = uVar15 + 1;
    } while (uVar15 < RemSP::length_);
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar9;
  puVar6 = RemSP::P_;
  pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  uVar9 = *(uint *)&pMVar2->field_0x8;
  uVar22 = uVar9 & 0xfffffffe;
  uVar20 = *(uint *)&pMVar2->field_0xc;
  uVar16 = (long)(int)uVar20 & 0xfffffffffffffffe;
  uVar15 = 0;
  iVar14 = (int)uVar16;
  if (0 < (int)uVar22) {
    pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    lVar19 = *(long *)&pMVar3->field_0x10;
    lVar4 = **(long **)&pMVar3->field_0x48;
    lVar5 = *(long *)&pMVar2->field_0x10;
    lVar26 = **(long **)&pMVar2->field_0x48;
    lVar24 = lVar5 + lVar26;
    lVar10 = lVar19 + 1 + lVar4;
    lVar21 = lVar19 + 1;
    uVar15 = 0;
    lVar11 = lVar5;
    do {
      puVar7 = RemSP::P_;
      lVar25 = lVar26 * uVar15 + lVar5;
      lVar1 = lVar25 + lVar26;
      if (iVar14 < 1) {
        uVar8 = 0;
      }
      else {
        uVar8 = 0;
        do {
          lVar23 = (long)*(int *)(lVar11 + uVar8 * 4);
          if (lVar23 < 1) {
            *(undefined8 *)(lVar11 + uVar8 * 4) = 0;
            uVar13 = uVar8 + 1;
            *(undefined4 *)(lVar24 + uVar8 * 4) = 0;
            uVar17 = 0;
          }
          else {
            uVar17 = puVar7[lVar23];
            uVar12 = uVar17;
            if (*(char *)(lVar21 + -1 + uVar8) == '\0') {
              uVar12 = 0;
            }
            *(uint *)(lVar11 + uVar8 * 4) = uVar12;
            uVar13 = uVar8 | 1;
            uVar12 = uVar17;
            if (*(char *)(lVar21 + uVar8) == '\0') {
              uVar12 = 0;
            }
            *(uint *)(lVar11 + 4 + uVar8 * 4) = uVar12;
            uVar12 = uVar17;
            if (*(char *)(lVar10 + -1 + uVar8) == '\0') {
              uVar12 = 0;
            }
            *(uint *)(lVar24 + uVar8 * 4) = uVar12;
            if (*(char *)(lVar10 + uVar8) == '\0') {
              uVar17 = 0;
            }
          }
          *(uint *)(lVar1 + uVar13 * 4) = uVar17;
          uVar8 = uVar8 + 2;
        } while ((long)uVar8 < (long)uVar16);
      }
      if ((uVar20 & 0x80000001) == 1) {
        lVar23 = (long)*(int *)(lVar25 + uVar8 * 4);
        if (lVar23 < 1) {
          *(undefined4 *)(lVar25 + uVar8 * 4) = 0;
          *(undefined4 *)(lVar1 + uVar8 * 4) = 0;
        }
        else {
          lVar18 = lVar4 * uVar15 + lVar19;
          uVar17 = puVar6[lVar23];
          uVar12 = uVar17;
          if (*(char *)(lVar18 + uVar8) == '\0') {
            uVar12 = 0;
          }
          *(uint *)(lVar25 + uVar8 * 4) = uVar12;
          if (*(char *)(lVar18 + lVar4 + uVar8) == '\0') {
            *(undefined4 *)(lVar1 + uVar8 * 4) = 0;
          }
          else {
            *(uint *)(lVar1 + uVar8 * 4) = uVar17;
          }
        }
      }
      uVar15 = uVar15 + 2;
      lVar24 = lVar24 + lVar26 * 2;
      lVar10 = lVar10 + lVar4 * 2;
      lVar21 = lVar21 + lVar4 * 2;
      lVar11 = lVar11 + lVar26 * 2;
    } while (uVar15 < uVar22);
    uVar15 = uVar15 & 0xffffffff;
  }
  puVar6 = RemSP::P_;
  if ((uVar9 & 0x80000001) == 1) {
    pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    lVar21 = *(long *)&pMVar3->field_0x10;
    lVar19 = **(long **)&pMVar3->field_0x48 * uVar15;
    lVar24 = *(long *)&pMVar2->field_0x10;
    lVar10 = uVar15 * **(long **)&pMVar2->field_0x48;
    if (iVar14 < 1) {
      uVar15 = 0;
    }
    else {
      lVar4 = lVar19 + lVar21;
      lVar5 = lVar10 + lVar24;
      uVar15 = 0;
      do {
        lVar26 = (long)*(int *)(lVar5 + uVar15 * 4);
        if (lVar26 < 1) {
          *(undefined8 *)(lVar5 + uVar15 * 4) = 0;
        }
        else {
          uVar9 = puVar6[lVar26];
          uVar22 = uVar9;
          if (*(char *)(lVar4 + uVar15) == '\0') {
            uVar22 = 0;
          }
          *(uint *)(lVar5 + uVar15 * 4) = uVar22;
          if (*(char *)(lVar4 + 1 + uVar15) == '\0') {
            *(undefined4 *)(lVar5 + 4 + uVar15 * 4) = 0;
          }
          else {
            *(uint *)(lVar5 + 4 + uVar15 * 4) = uVar9;
          }
        }
        uVar15 = uVar15 + 2;
      } while (uVar15 < ((long)(int)uVar20 & 0xfffffffeU));
    }
    if ((uVar20 & 0x80000001) == 1) {
      lVar24 = lVar24 + lVar10;
      lVar10 = (long)*(int *)(lVar24 + uVar15 * 4);
      uVar9 = 0;
      if ((0 < lVar10) && (uVar9 = 0, *(char *)(lVar21 + lVar19 + uVar15) != '\0')) {
        uVar9 = RemSP::P_[lVar10];
      }
      *(uint *)(lVar24 + uVar15 * 4) = uVar9;
    }
  }
  return;
}

Assistant:

void Dealloc()
    {
        LabelsSolver::Dealloc();
        // No free for img_labels_ because it is required at the end of the algorithm 
    }